

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  long lVar1;
  char ichar;
  long lVar2;
  serializer s;
  __shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
  local_2d0;
  __shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
  local_2c0;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_2b0;
  
  lVar1 = *(long *)(o + *(long *)(*(long *)o + -0x18) + 0x10);
  lVar2 = 0;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 0x10) = 0;
  detail::
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::output_adapter((output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2c0,o);
  std::__shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_2d0,&local_2c0);
  ichar = std::ios::fill();
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::serializer(&local_2b0,(output_adapter_t<char> *)&local_2d0,ichar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::dump(&local_2b0,j,0 < lVar1,false,(uint)lVar2,0);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::~serializer(&local_2b0);
  return o;
}

Assistant:

friend std::ostream& operator<<(std::ostream& o, const basic_json& j)
{
// read width member and use it as indentation parameter if nonzero
const bool pretty_print = (o.width() > 0);
const auto indentation = (pretty_print ? o.width() : 0);

// reset width to 0 for subsequent calls to this stream
o.width(0);

// do the actual serialization
serializer s(detail::output_adapter<char>(o), o.fill());
s.dump(j, pretty_print, false, static_cast<unsigned int>(indentation));
return o;
}